

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::TrackNoImplicitCallInlinees(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (this->tag != DeadStorePhase) {
    return false;
  }
  if (this->currentPrePassLoop != (Loop *)0x0) {
    return false;
  }
  if (((((instr->field_0x38 & 0x10) == 0) &&
       (bVar2 = OpCodeAttr::CallInstr(instr->m_opcode), !bVar2)) &&
      (bVar2 = IR::Instr::CallsAccessor(instr,(PropertySymOpnd *)0x0), !bVar2)) &&
     ((bVar2 = GlobOpt::MayNeedBailOnImplicitCall(instr,(Value *)0x0,(Value *)0x0), !bVar2 &&
      (bVar2 = IR::Instr::HasAnyLoadHeapArgsOpCode(instr), !bVar2)))) {
    if (instr->m_opcode == InlineeStart) {
      if (instr->m_src1 != (Opnd *)0x0) {
        bVar2 = ProcessInlineeStart(this,instr);
        return bVar2;
      }
      if ((instr->m_func->field_0x240 & 2) != 0) {
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1fec,"(instr->m_func->m_hasInlineArgsOpt)",
                         "instr->m_func->m_hasInlineArgsOpt");
      if (bVar2) {
        *puVar3 = 0;
        return false;
      }
      goto LAB_003cac87;
    }
    if (instr->m_opcode != LdFuncExpr) {
      return false;
    }
  }
  if (instr->m_opcode == InlineeStart) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1fe3,"(instr->m_opcode != Js::OpCode::InlineeStart)",
                       "instr->m_opcode != Js::OpCode::InlineeStart");
    if (!bVar2) {
LAB_003cac87:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Func::SetHasImplicitCallsOnSelfAndParents(instr->m_func);
  return false;
}

Assistant:

bool
BackwardPass::TrackNoImplicitCallInlinees(IR::Instr *instr)
{
    if (this->tag != Js::DeadStorePhase || this->IsPrePass())
    {
        return false;
    }

    if (instr->HasBailOutInfo()
        || OpCodeAttr::CallInstr(instr->m_opcode)
        || instr->CallsAccessor()
        || GlobOpt::MayNeedBailOnImplicitCall(instr, nullptr, nullptr)
        || instr->HasAnyLoadHeapArgsOpCode()
        || instr->m_opcode == Js::OpCode::LdFuncExpr)
    {
        // This func has instrs with bailouts or implicit calls
        Assert(instr->m_opcode != Js::OpCode::InlineeStart);
        instr->m_func->SetHasImplicitCallsOnSelfAndParents();
        return false;
    }

    if (instr->m_opcode == Js::OpCode::InlineeStart)
    {
        if (!instr->GetSrc1())
        {
            Assert(instr->m_func->m_hasInlineArgsOpt);
            return false;
        }
        return this->ProcessInlineeStart(instr);
    }

    return false;
}